

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O1

void __thiscall TRM::Bitmap::FlipHorizontally(Bitmap *this)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  pointer pCVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  uVar2 = this->fWidth;
  if ((this->fHeight * uVar2 != 0) && (1 < uVar2)) {
    uVar5 = 0;
    do {
      if (this->fHeight != 0) {
        uVar6 = 0;
        do {
          iVar8 = this->fWidth * uVar6;
          uVar1 = iVar8 + uVar5;
          pCVar4 = (this->fPixels).super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = this->fWidth + ~uVar5 + iVar8;
          uVar3 = *(undefined4 *)pCVar4[uVar1].fRGBA._M_elems;
          *(undefined4 *)pCVar4[uVar1].fRGBA._M_elems = *(undefined4 *)pCVar4[uVar7].fRGBA._M_elems;
          *(undefined4 *)pCVar4[uVar7].fRGBA._M_elems = uVar3;
          uVar6 = uVar6 + 1;
        } while (uVar6 < this->fHeight);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2 >> 1);
  }
  return;
}

Assistant:

void Bitmap::FlipHorizontally() {
  if (fWidth * fHeight <= 0) {
    return;
  }

  int32_t half_width = fWidth >> 1;
  for (int32_t i = 0; i < half_width; i++) {
    for (int32_t j = 0; j < fHeight; j++) {
      std::swap(fPixels[i + j * fWidth], fPixels[fWidth - 1 - i + j * fWidth]);
    }
  }
}